

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

void qclab::printMatrix2x2<qclab::dense::SquareMatrix<std::complex<float>>>
               (SquareMatrix<std::complex<float>_> *mat)

{
  int64_t iVar1;
  complex<float> cVar2;
  SquareMatrix<std::complex<float>_> *mat_local;
  
  iVar1 = dense::SquareMatrix<std::complex<float>_>::rows(mat);
  if (iVar1 != 2) {
    __assert_fail("mat.rows() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/util.hpp"
                  ,0x61,
                  "void qclab::printMatrix2x2(const T &) [T = qclab::dense::SquareMatrix<std::complex<float>>]"
                 );
  }
  iVar1 = dense::SquareMatrix<std::complex<float>_>::cols(mat);
  if (iVar1 == 2) {
    cVar2._M_value = (_ComplexT)mat;
    dense::SquareMatrix<std::complex<float>_>::operator()(mat,0,0);
    print<float>(cVar2);
    cVar2._M_value = (_ComplexT)mat;
    dense::SquareMatrix<std::complex<float>_>::operator()(mat,0,1);
    print<float>(cVar2);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    cVar2._M_value = (_ComplexT)mat;
    dense::SquareMatrix<std::complex<float>_>::operator()(mat,1,0);
    print<float>(cVar2);
    dense::SquareMatrix<std::complex<float>_>::operator()(mat,1,1);
    print<float>((complex<float>)mat);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    return;
  }
  __assert_fail("mat.cols() == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/util.hpp"
                ,0x62,
                "void qclab::printMatrix2x2(const T &) [T = qclab::dense::SquareMatrix<std::complex<float>>]"
               );
}

Assistant:

void printMatrix2x2( const T& mat ) {
    assert( mat.rows() == 2 ) ;
    assert( mat.cols() == 2 ) ;
    print( mat(0,0) ) ; print( mat(0,1) ) ; std::cout << std::endl ;
    print( mat(1,0) ) ; print( mat(1,1) ) ; std::cout << std::endl ;
  }